

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O3

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::visitTryTableStart
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,TryTable *trytable,Name label,
          Type inputType)

{
  _Variadic_union<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
  local_e8;
  undefined1 local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8;
  uintptr_t local_a0;
  undefined4 local_98;
  void *local_90;
  undefined8 uStack_88;
  long local_80;
  void *pvStack_78;
  undefined8 local_70;
  long lStack_68;
  void *local_60;
  undefined1 uStack_58;
  undefined7 uStack_57;
  undefined1 local_50;
  undefined7 uStack_4f;
  undefined1 uStack_48;
  undefined8 local_40;
  uintptr_t local_38;
  
  local_38 = inputType.id;
  applyDebugLoc(this,(Expression *)trytable);
  local_d0 = 9;
  local_c8 = 0;
  uStack_c0 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_a8 = 0;
  local_a0 = local_38;
  local_98 = 0xffffffff;
  local_40 = 0;
  local_90 = (void *)0x0;
  uStack_88 = 0;
  local_80 = 0;
  pvStack_78 = (void *)0x0;
  local_70 = 0;
  lStack_68 = 0;
  local_60 = (void *)0x0;
  uStack_58 = 0;
  uStack_57 = 0;
  local_50 = 0;
  uStack_4f = 0;
  uStack_48 = 0;
  local_e8._0_8_ = trytable;
  local_e8._8_8_ = label.super_IString.str._M_len;
  local_e8._16_8_ = label.super_IString.str._M_str;
  pushScope(__return_storage_ptr__,this,(ScopeCtx *)&local_e8);
  if (local_60 != (void *)0x0) {
    operator_delete(local_60,CONCAT71(uStack_4f,local_50) - (long)local_60);
  }
  if (pvStack_78 != (void *)0x0) {
    operator_delete(pvStack_78,lStack_68 - (long)pvStack_78);
  }
  if (local_90 != (void *)0x0) {
    operator_delete(local_90,local_80 - (long)local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<>
IRBuilder::visitTryTableStart(TryTable* trytable, Name label, Type inputType) {
  applyDebugLoc(trytable);
  return pushScope(ScopeCtx::makeTryTable(trytable, label, inputType));
}